

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::ChCollisionModelBullet::~ChCollisionModelBullet(ChCollisionModelBullet *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  cbtCollisionObject *pcVar1;
  
  (this->super_ChCollisionModel)._vptr_ChCollisionModel =
       (_func_int **)&PTR__ChCollisionModelBullet_00b63e10;
  std::
  vector<std::shared_ptr<chrono::geometry::ChTriangleMesh>,_std::allocator<std::shared_ptr<chrono::geometry::ChTriangleMesh>_>_>
  ::~vector(&this->m_trimeshes);
  this_00 = (this->bt_compound_shape).
            super___shared_ptr<cbtCompoundShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar1 = (this->bt_collision_object)._M_t.
           super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
           super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
           super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl;
  if (pcVar1 != (cbtCollisionObject *)0x0) {
    (*pcVar1->_vptr_cbtCollisionObject[1])();
  }
  (this->bt_collision_object)._M_t.
  super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
  super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
  super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl = (cbtCollisionObject *)0x0;
  (this->super_ChCollisionModel)._vptr_ChCollisionModel =
       (_func_int **)&PTR__ChCollisionModel_00b63c90;
  std::
  vector<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
  ::~vector(&(this->super_ChCollisionModel).m_shapes);
  return;
}

Assistant:

ChCollisionModelBullet::~ChCollisionModelBullet() {}